

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDLImporter::CopyMaterials_3DGS_MDL7(MDLImporter *this,IntSharedData_MDL7 *shared)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  aiMaterial **ppaVar4;
  reference ppaVar5;
  uint local_1c;
  uint i;
  IntSharedData_MDL7 *shared_local;
  MDLImporter *this_local;
  
  sVar2 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::size(&shared->pcMats);
  this->pScene->mNumMaterials = (uint)sVar2;
  auVar1 = ZEXT416(this->pScene->mNumMaterials) * ZEXT816(8);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppaVar4 = (aiMaterial **)operator_new__(uVar3);
  this->pScene->mMaterials = ppaVar4;
  for (local_1c = 0; local_1c < this->pScene->mNumMaterials; local_1c = local_1c + 1) {
    ppaVar5 = std::vector<aiMaterial_*,_std::allocator<aiMaterial_*>_>::operator[]
                        (&shared->pcMats,(ulong)local_1c);
    this->pScene->mMaterials[local_1c] = *ppaVar5;
  }
  return;
}

Assistant:

void MDLImporter::CopyMaterials_3DGS_MDL7(MDL::IntSharedData_MDL7 &shared)
{
    pScene->mNumMaterials = (unsigned int)shared.pcMats.size();
    pScene->mMaterials = new aiMaterial*[pScene->mNumMaterials];
    for (unsigned int i = 0; i < pScene->mNumMaterials;++i)
        pScene->mMaterials[i] = shared.pcMats[i];
}